

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

void __thiscall
UnifiedRegex::CharSet<char16_t>::ToComplement
          (CharSet<char16_t> *this,ArenaAllocator *allocator,CharSet<char16_t> *result)

{
  CharSetNode *pCVar1;
  Char hc;
  Char CVar2;
  uint uVar3;
  uint i;
  uint index;
  
  if ((this->rep).compact.countPlusOne - 1 < 5) {
    Sort(this);
    uVar3 = GetCompactLength(this);
    if (uVar3 == 0) {
      uVar3 = GetCompactLength(this);
      if (uVar3 != 0) {
        return;
      }
      CVar2 = L'\0';
    }
    else {
      index = 0;
      uVar3 = GetCompactCharU(this,0);
      CVar2 = L'\0';
      if (uVar3 != 0) goto LAB_00cd993f;
      while (uVar3 = GetCompactLength(this), index < uVar3 - 1) {
        uVar3 = GetCompactCharU(this,index);
        CVar2 = Chars<char16_t>::UTC(uVar3 + 1);
        index = index + 1;
LAB_00cd993f:
        uVar3 = GetCompactCharU(this,index);
        hc = Chars<char16_t>::UTC(uVar3 - 1);
        SetRange(result,allocator,CVar2,hc);
      }
      uVar3 = GetCompactLength(this);
      uVar3 = GetCompactCharU(this,uVar3 - 1);
      if (0xfffe < uVar3) {
        return;
      }
      uVar3 = GetCompactLength(this);
      uVar3 = GetCompactCharU(this,uVar3 - 1);
      CVar2 = Chars<char16_t>::UTC(uVar3 + 1);
    }
  }
  else {
    CharBitvec::ToComplement<char16_t>(&(this->rep).full.direct,allocator,0,result);
    pCVar1 = (this->rep).full.root;
    if (pCVar1 != (CharSetNode *)0x0) {
      (*pCVar1->_vptr_CharSetNode[6])(pCVar1,allocator,2,0,result);
      return;
    }
    CVar2 = L'Ā';
  }
  SetRange(result,allocator,CVar2,L'\xffff');
  return;
}

Assistant:

void CharSet<char16>::ToComplement(ArenaAllocator* allocator, CharSet<Char>& result)
    {
        if (IsCompact())
        {
            Sort();
            if (this->GetCompactLength() > 0)
            {
                if (this->GetCompactCharU(0) > 0)
                    result.SetRange(allocator, UTC(0), UTC(this->GetCompactCharU(0) - 1));
                for (uint i = 0; i < this->GetCompactLength() - 1; i++)
                {
                    result.SetRange(allocator, UTC(this->GetCompactCharU(i) + 1), UTC(this->GetCompactCharU(i + 1) - 1));
                }
                if (this->GetCompactCharU(this->GetCompactLength() - 1) < MaxUChar)
                {
                    result.SetRange(allocator, UTC(this->GetCompactCharU(this->GetCompactLength() - 1) + 1), UTC(MaxUChar));
                }
            }
            else if (this->GetCompactLength() == 0)
            {
                result.SetRange(allocator, UTC(0), UTC(MaxUChar));
            }
        }
        else
        {
            rep.full.direct.ToComplement<char16>(allocator, 0, result);
            if (rep.full.root == nullptr)
                result.SetRange(allocator, UTC(CharSetNode::directSize), MaxChar);
            else
                rep.full.root->ToComplement(allocator, CharSetNode::levels - 1, 0, result);
        }
    }